

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

int hex_to_u64(uint8_t *in,int in_len,uint64_t *out)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  ulong uVar4;
  ulong *puVar5;
  
  iVar1 = 0;
  if (((((in_len & 0xfU) == 0) && (in != (uint8_t *)0x0)) && (out != (uint64_t *)0x0)) &&
     (iVar1 = 1, 0 < in_len)) {
    puVar3 = in + 1;
    iVar2 = 0;
    do {
      uVar4 = 0xfffffffffffffffe;
      puVar5 = out;
      do {
        *(uint8_t *)puVar5 =
             inv_ascii_table[puVar3[uVar4 + 1]] << 4 | inv_ascii_table[puVar3[uVar4 + 2]];
        puVar5 = (ulong *)((long)puVar5 + 1);
        uVar4 = uVar4 + 2;
      } while (uVar4 < 0xe);
      uVar4 = *out;
      *out = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
             (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
             (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
      out = out + 1;
      iVar2 = iVar2 + 0x10;
      puVar3 = puVar3 + 0x10;
    } while (iVar2 < in_len);
  }
  return iVar1;
}

Assistant:

int hex_to_u64(const uint8_t *in, int in_len, uint64_t *out)
{
    if (in == NULL || out == NULL)
        return GML_ERROR;

    if (in_len % 16 != 0)
        return GML_ERROR;

    for (int i = 0; i < in_len; i += 16) {
        hex_to_u8(in + i, 16, (uint8_t*)out);
        if (ENDIANESS == ORDER_LITTLE_ENDIAN)
            out[0] = BSWAP8(out[0]);
        out++;
    }

    return GML_OK;
}